

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_openssl.cpp
# Opt level: O3

QSslCertificate __thiscall
QTlsPrivate::X509CertificateOpenSSL::certificateFromX509(X509CertificateOpenSSL *this,X509 *x509)

{
  X509CertificateOpenSSL *this_00;
  QArrayData *pQVar1;
  char *pcVar2;
  qsizetype qVar3;
  AllocationOption AVar4;
  QMultiMap<QByteArray,_QString> QVar5;
  ASN1_TIME *pAVar6;
  X509 *pXVar7;
  X509_NAME *pXVar8;
  long lVar9;
  ASN1_INTEGER *pAVar10;
  AllocationOption AVar11;
  long in_FS_OFFSET;
  QArrayData *local_88 [3];
  QMultiMap<QByteArray,_QString> local_70 [3];
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&this->super_X509CertificateBase = &DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char *)0x0;
  local_58.d.size = 0;
  QSslCertificate::QSslCertificate((QSslCertificate *)this,&local_58,Pem);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  this_00 = *(X509CertificateOpenSSL **)(*(long *)&this->super_X509CertificateBase + 8);
  if (x509 != (X509 *)0x0 && this_00 != (X509CertificateOpenSSL *)0x0) {
    pAVar6 = q_X509_getm_notBefore(x509);
    if (pAVar6 != (ASN1_TIME *)0x0) {
      anon_unknown_2::dateTimeFromASN1((anon_unknown_2 *)&local_58,pAVar6);
      pQVar1 = *(QArrayData **)&(this_00->super_X509CertificateBase).notValidBefore;
      *(Data **)&(this_00->super_X509CertificateBase).notValidBefore = local_58.d.d;
      local_58.d.d = (Data *)pQVar1;
      QDateTime::~QDateTime((QDateTime *)&local_58);
    }
    pAVar6 = q_X509_getm_notAfter(x509);
    if (pAVar6 != (ASN1_TIME *)0x0) {
      anon_unknown_2::dateTimeFromASN1((anon_unknown_2 *)&local_58,pAVar6);
      pQVar1 = *(QArrayData **)&(this_00->super_X509CertificateBase).notValidAfter;
      *(Data **)&(this_00->super_X509CertificateBase).notValidAfter = local_58.d.d;
      local_58.d.d = (Data *)pQVar1;
      QDateTime::~QDateTime((QDateTime *)&local_58);
    }
    (this_00->super_X509CertificateBase).null = false;
    pXVar7 = q_X509_dup(x509);
    this_00->x509 = pXVar7;
    pXVar8 = q_X509_get_issuer_name(x509);
    anon_unknown_2::mapFromX509Name((anon_unknown_2 *)local_70,pXVar8);
    QVar5.d.d.ptr = local_70[0].d.d.ptr;
    local_70[0].d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_*>
            )0x0;
    local_58.d.d = (Data *)(this_00->super_X509CertificateBase).issuerInfoEntries.d.d.ptr;
    (this_00->super_X509CertificateBase).issuerInfoEntries.d.d.ptr =
         (QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>
          *)QVar5.d.d.ptr;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
                *)&local_58);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
                *)local_70);
    pXVar8 = q_X509_get_subject_name(x509);
    anon_unknown_2::mapFromX509Name((anon_unknown_2 *)local_70,pXVar8);
    QVar5.d.d.ptr = local_70[0].d.d.ptr;
    local_70[0].d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_*>
            )0x0;
    local_58.d.d = (Data *)(this_00->super_X509CertificateBase).subjectInfoEntries.d.d.ptr;
    (this_00->super_X509CertificateBase).subjectInfoEntries.d.d.ptr =
         (QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>
          *)QVar5.d.d.ptr;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
                *)&local_58);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
                *)local_70);
    lVar9 = q_X509_get_version(x509);
    QByteArray::number((longlong)&local_58,(int)lVar9 + 1);
    pQVar1 = &((this_00->super_X509CertificateBase).versionString.d.d)->super_QArrayData;
    pcVar2 = (this_00->super_X509CertificateBase).versionString.d.ptr;
    (this_00->super_X509CertificateBase).versionString.d.d = local_58.d.d;
    (this_00->super_X509CertificateBase).versionString.d.ptr = local_58.d.ptr;
    qVar3 = (this_00->super_X509CertificateBase).versionString.d.size;
    (this_00->super_X509CertificateBase).versionString.d.size = local_58.d.size;
    local_58.d.d = (Data *)pQVar1;
    local_58.d.ptr = pcVar2;
    local_58.d.size = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,1,0x10);
      }
    }
    pAVar10 = q_X509_get_serialNumber(x509);
    if (pAVar10 != (ASN1_INTEGER *)0x0) {
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char *)0x0;
      local_58.d.size = 0;
      AVar4 = pAVar10->length * 3;
      AVar11 = Grow;
      if (0 < (int)AVar4) {
        AVar11 = AVar4;
      }
      QByteArray::reallocData((longlong)&local_58,AVar11);
      if ((&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) &&
         (*(qsizetype *)((long)local_58.d.d + 8) != 0)) {
        *(byte *)&(((ArrayOptions *)((long)local_58.d.d + 4))->
                  super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(((ArrayOptions *)((long)local_58.d.d + 4))->
                   super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      if (0 < pAVar10->length) {
        lVar9 = 0;
        do {
          QByteArray::number((int)local_88,(uint)pAVar10->data[lVar9]);
          QByteArray::rightJustified((longlong)local_70,(char)local_88,true);
          QByteArray::append(&local_58);
          if (local_70[0].d.d.ptr !=
              (totally_ordered_wrapper<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_*>
               )0x0) {
            LOCK();
            *(int *)local_70[0].d.d.ptr = *(int *)local_70[0].d.d.ptr + -1;
            UNLOCK();
            if (*(int *)local_70[0].d.d.ptr == 0) {
              QArrayData::deallocate((QArrayData *)local_70[0].d.d.ptr,1,0x10);
            }
          }
          if (local_88[0] != (QArrayData *)0x0) {
            LOCK();
            (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_88[0],1,0x10);
            }
          }
          QByteArray::append((char)&local_58);
          lVar9 = lVar9 + 1;
        } while (lVar9 < pAVar10->length);
      }
      QByteArray::chop((longlong)&local_58);
      QByteArray::operator=(&(this_00->super_X509CertificateBase).serialNumberString,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
        }
      }
    }
    parseExtensions(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
         (QExplicitlySharedDataPointer<QSslCertificatePrivate>)this;
}

Assistant:

QSslCertificate X509CertificateOpenSSL::certificateFromX509(X509 *x509)
{
    QSslCertificate certificate;

    auto *backend = QTlsBackend::backend<X509CertificateOpenSSL>(certificate);
    if (!backend || !x509)
        return certificate;

    ASN1_TIME *nbef = q_X509_getm_notBefore(x509);
    if (nbef)
        backend->notValidBefore = dateTimeFromASN1(nbef);

    ASN1_TIME *naft = q_X509_getm_notAfter(x509);
    if (naft)
        backend->notValidAfter = dateTimeFromASN1(naft);

    backend->null = false;
    backend->x509 = q_X509_dup(x509);

    backend->issuerInfoEntries = mapFromX509Name(q_X509_get_issuer_name(x509));
    backend->subjectInfoEntries = mapFromX509Name(q_X509_get_subject_name(x509));
    backend->versionString = QByteArray::number(qlonglong(q_X509_get_version(x509)) + 1);

    if (ASN1_INTEGER *serialNumber = q_X509_get_serialNumber(x509)) {
        QByteArray hexString;
        hexString.reserve(serialNumber->length * 3);
        for (int a = 0; a < serialNumber->length; ++a) {
            hexString += QByteArray::number(serialNumber->data[a], 16).rightJustified(2, '0');
            hexString += ':';
        }
        hexString.chop(1);
        backend->serialNumberString = hexString;
    }

    backend->parseExtensions();

    return certificate;
}